

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void YuvToRgbRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  __m128i *in_RCX;
  int in_R8D;
  __m128i rgb5;
  __m128i rgb4;
  __m128i rgb3;
  __m128i rgb2;
  __m128i rgb1;
  __m128i rgb0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i G3;
  __m128i G2;
  __m128i G1;
  __m128i G0;
  __m128i R3;
  __m128i R2;
  __m128i R1;
  __m128i R0;
  int n;
  __m128i *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  char in_stack_fffffffffffffe08;
  char in_stack_fffffffffffffe09;
  char in_stack_fffffffffffffe0a;
  char in_stack_fffffffffffffe0b;
  char in_stack_fffffffffffffe0c;
  char in_stack_fffffffffffffe0d;
  char in_stack_fffffffffffffe0e;
  char in_stack_fffffffffffffe0f;
  char in_stack_fffffffffffffe10;
  char in_stack_fffffffffffffe11;
  char in_stack_fffffffffffffe12;
  char in_stack_fffffffffffffe13;
  char in_stack_fffffffffffffe14;
  char in_stack_fffffffffffffe15;
  char in_stack_fffffffffffffe16;
  char in_stack_fffffffffffffe17;
  char in_stack_fffffffffffffe18;
  char in_stack_fffffffffffffe19;
  char in_stack_fffffffffffffe1a;
  char in_stack_fffffffffffffe1b;
  char in_stack_fffffffffffffe1c;
  char in_stack_fffffffffffffe1d;
  char in_stack_fffffffffffffe1e;
  char in_stack_fffffffffffffe1f;
  char in_stack_fffffffffffffe20;
  char in_stack_fffffffffffffe21;
  char in_stack_fffffffffffffe22;
  char in_stack_fffffffffffffe23;
  char in_stack_fffffffffffffe24;
  char in_stack_fffffffffffffe25;
  char in_stack_fffffffffffffe26;
  char in_stack_fffffffffffffe27;
  char in_stack_fffffffffffffe28;
  char in_stack_fffffffffffffe29;
  char in_stack_fffffffffffffe2a;
  char in_stack_fffffffffffffe2b;
  char in_stack_fffffffffffffe2c;
  char in_stack_fffffffffffffe2d;
  char in_stack_fffffffffffffe2e;
  char in_stack_fffffffffffffe2f;
  char in_stack_fffffffffffffe30;
  char in_stack_fffffffffffffe31;
  char in_stack_fffffffffffffe32;
  char in_stack_fffffffffffffe33;
  char in_stack_fffffffffffffe34;
  char in_stack_fffffffffffffe35;
  char in_stack_fffffffffffffe36;
  char in_stack_fffffffffffffe37;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  uint8_t *in_stack_fffffffffffffec0;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_f0;
  __m128i *local_e8;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  
  local_e8 = in_RCX;
  for (local_f0 = 0; local_f0 + 0x20 <= in_R8D; local_f0 = local_f0 + 0x20) {
    YUV420ToRGB_SSE2((uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT15(in_stack_fffffffffffffe35,
                                                CONCAT14(in_stack_fffffffffffffe34,
                                                         CONCAT13(in_stack_fffffffffffffe33,
                                                                  CONCAT12(in_stack_fffffffffffffe32
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe2f,
                              CONCAT16(in_stack_fffffffffffffe2e,
                                       CONCAT15(in_stack_fffffffffffffe2d,
                                                CONCAT14(in_stack_fffffffffffffe2c,
                                                         CONCAT13(in_stack_fffffffffffffe2b,
                                                                  CONCAT12(in_stack_fffffffffffffe2a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe27,
                              CONCAT16(in_stack_fffffffffffffe26,
                                       CONCAT15(in_stack_fffffffffffffe25,
                                                CONCAT14(in_stack_fffffffffffffe24,
                                                         CONCAT13(in_stack_fffffffffffffe23,
                                                                  CONCAT12(in_stack_fffffffffffffe22
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT15(in_stack_fffffffffffffe1d,
                                                CONCAT14(in_stack_fffffffffffffe1c,
                                                         CONCAT13(in_stack_fffffffffffffe1b,
                                                                  CONCAT12(in_stack_fffffffffffffe1a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         CONCAT13(in_stack_fffffffffffffe13,
                                                                  CONCAT12(in_stack_fffffffffffffe12
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT15(in_stack_fffffffffffffe0d,
                                                CONCAT14(in_stack_fffffffffffffe0c,
                                                         CONCAT13(in_stack_fffffffffffffe0b,
                                                                  CONCAT12(in_stack_fffffffffffffe0a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe09,
                                                  in_stack_fffffffffffffe08))))))));
    YUV420ToRGB_SSE2((uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT15(in_stack_fffffffffffffe35,
                                                CONCAT14(in_stack_fffffffffffffe34,
                                                         CONCAT13(in_stack_fffffffffffffe33,
                                                                  CONCAT12(in_stack_fffffffffffffe32
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe2f,
                              CONCAT16(in_stack_fffffffffffffe2e,
                                       CONCAT15(in_stack_fffffffffffffe2d,
                                                CONCAT14(in_stack_fffffffffffffe2c,
                                                         CONCAT13(in_stack_fffffffffffffe2b,
                                                                  CONCAT12(in_stack_fffffffffffffe2a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe27,
                              CONCAT16(in_stack_fffffffffffffe26,
                                       CONCAT15(in_stack_fffffffffffffe25,
                                                CONCAT14(in_stack_fffffffffffffe24,
                                                         CONCAT13(in_stack_fffffffffffffe23,
                                                                  CONCAT12(in_stack_fffffffffffffe22
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT15(in_stack_fffffffffffffe1d,
                                                CONCAT14(in_stack_fffffffffffffe1c,
                                                         CONCAT13(in_stack_fffffffffffffe1b,
                                                                  CONCAT12(in_stack_fffffffffffffe1a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         CONCAT13(in_stack_fffffffffffffe13,
                                                                  CONCAT12(in_stack_fffffffffffffe12
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT15(in_stack_fffffffffffffe0d,
                                                CONCAT14(in_stack_fffffffffffffe0c,
                                                         CONCAT13(in_stack_fffffffffffffe0b,
                                                                  CONCAT12(in_stack_fffffffffffffe0a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe09,
                                                  in_stack_fffffffffffffe08))))))));
    YUV420ToRGB_SSE2((uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT15(in_stack_fffffffffffffe35,
                                                CONCAT14(in_stack_fffffffffffffe34,
                                                         CONCAT13(in_stack_fffffffffffffe33,
                                                                  CONCAT12(in_stack_fffffffffffffe32
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe2f,
                              CONCAT16(in_stack_fffffffffffffe2e,
                                       CONCAT15(in_stack_fffffffffffffe2d,
                                                CONCAT14(in_stack_fffffffffffffe2c,
                                                         CONCAT13(in_stack_fffffffffffffe2b,
                                                                  CONCAT12(in_stack_fffffffffffffe2a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe27,
                              CONCAT16(in_stack_fffffffffffffe26,
                                       CONCAT15(in_stack_fffffffffffffe25,
                                                CONCAT14(in_stack_fffffffffffffe24,
                                                         CONCAT13(in_stack_fffffffffffffe23,
                                                                  CONCAT12(in_stack_fffffffffffffe22
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT15(in_stack_fffffffffffffe1d,
                                                CONCAT14(in_stack_fffffffffffffe1c,
                                                         CONCAT13(in_stack_fffffffffffffe1b,
                                                                  CONCAT12(in_stack_fffffffffffffe1a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         CONCAT13(in_stack_fffffffffffffe13,
                                                                  CONCAT12(in_stack_fffffffffffffe12
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT15(in_stack_fffffffffffffe0d,
                                                CONCAT14(in_stack_fffffffffffffe0c,
                                                         CONCAT13(in_stack_fffffffffffffe0b,
                                                                  CONCAT12(in_stack_fffffffffffffe0a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe09,
                                                  in_stack_fffffffffffffe08))))))));
    YUV420ToRGB_SSE2((uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT15(in_stack_fffffffffffffe35,
                                                CONCAT14(in_stack_fffffffffffffe34,
                                                         CONCAT13(in_stack_fffffffffffffe33,
                                                                  CONCAT12(in_stack_fffffffffffffe32
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe2f,
                              CONCAT16(in_stack_fffffffffffffe2e,
                                       CONCAT15(in_stack_fffffffffffffe2d,
                                                CONCAT14(in_stack_fffffffffffffe2c,
                                                         CONCAT13(in_stack_fffffffffffffe2b,
                                                                  CONCAT12(in_stack_fffffffffffffe2a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                     (uint8_t *)
                     CONCAT17(in_stack_fffffffffffffe27,
                              CONCAT16(in_stack_fffffffffffffe26,
                                       CONCAT15(in_stack_fffffffffffffe25,
                                                CONCAT14(in_stack_fffffffffffffe24,
                                                         CONCAT13(in_stack_fffffffffffffe23,
                                                                  CONCAT12(in_stack_fffffffffffffe22
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT15(in_stack_fffffffffffffe1d,
                                                CONCAT14(in_stack_fffffffffffffe1c,
                                                         CONCAT13(in_stack_fffffffffffffe1b,
                                                                  CONCAT12(in_stack_fffffffffffffe1a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,
                                       CONCAT15(in_stack_fffffffffffffe15,
                                                CONCAT14(in_stack_fffffffffffffe14,
                                                         CONCAT13(in_stack_fffffffffffffe13,
                                                                  CONCAT12(in_stack_fffffffffffffe12
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))),
                     (__m128i *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT15(in_stack_fffffffffffffe0d,
                                                CONCAT14(in_stack_fffffffffffffe0c,
                                                         CONCAT13(in_stack_fffffffffffffe0b,
                                                                  CONCAT12(in_stack_fffffffffffffe0a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe09,
                                                  in_stack_fffffffffffffe08))))))));
    local_38 = (short)local_128;
    sStack_36 = (short)((ulong)local_128 >> 0x10);
    sStack_34 = (short)((ulong)local_128 >> 0x20);
    sStack_32 = (short)((ulong)local_128 >> 0x30);
    sStack_30 = (short)uStack_120;
    sStack_2e = (short)((ulong)uStack_120 >> 0x10);
    sStack_2c = (short)((ulong)uStack_120 >> 0x20);
    sStack_2a = (short)((ulong)uStack_120 >> 0x30);
    local_48 = (short)local_138;
    sStack_46 = (short)((ulong)local_138 >> 0x10);
    sStack_44 = (short)((ulong)local_138 >> 0x20);
    sStack_42 = (short)((ulong)local_138 >> 0x30);
    sStack_40 = (short)uStack_130;
    sStack_3e = (short)((ulong)uStack_130 >> 0x10);
    sStack_3c = (short)((ulong)uStack_130 >> 0x20);
    sStack_3a = (short)((ulong)uStack_130 >> 0x30);
    in_stack_fffffffffffffe28 =
         (0 < local_38) * (local_38 < 0x100) * (char)local_128 - (0xff < local_38);
    in_stack_fffffffffffffe29 =
         (0 < sStack_36) * (sStack_36 < 0x100) * (char)((ulong)local_128 >> 0x10) -
         (0xff < sStack_36);
    in_stack_fffffffffffffe2a =
         (0 < sStack_34) * (sStack_34 < 0x100) * (char)((ulong)local_128 >> 0x20) -
         (0xff < sStack_34);
    in_stack_fffffffffffffe2b =
         (0 < sStack_32) * (sStack_32 < 0x100) * (char)((ulong)local_128 >> 0x30) -
         (0xff < sStack_32);
    in_stack_fffffffffffffe2c =
         (0 < sStack_30) * (sStack_30 < 0x100) * (char)uStack_120 - (0xff < sStack_30);
    in_stack_fffffffffffffe2d =
         (0 < sStack_2e) * (sStack_2e < 0x100) * (char)((ulong)uStack_120 >> 0x10) -
         (0xff < sStack_2e);
    in_stack_fffffffffffffe2e =
         (0 < sStack_2c) * (sStack_2c < 0x100) * (char)((ulong)uStack_120 >> 0x20) -
         (0xff < sStack_2c);
    in_stack_fffffffffffffe2f =
         (0 < sStack_2a) * (sStack_2a < 0x100) * (char)((ulong)uStack_120 >> 0x30) -
         (0xff < sStack_2a);
    in_stack_fffffffffffffe30 =
         (0 < local_48) * (local_48 < 0x100) * (char)local_138 - (0xff < local_48);
    in_stack_fffffffffffffe31 =
         (0 < sStack_46) * (sStack_46 < 0x100) * (char)((ulong)local_138 >> 0x10) -
         (0xff < sStack_46);
    in_stack_fffffffffffffe32 =
         (0 < sStack_44) * (sStack_44 < 0x100) * (char)((ulong)local_138 >> 0x20) -
         (0xff < sStack_44);
    in_stack_fffffffffffffe33 =
         (0 < sStack_42) * (sStack_42 < 0x100) * (char)((ulong)local_138 >> 0x30) -
         (0xff < sStack_42);
    in_stack_fffffffffffffe34 =
         (0 < sStack_40) * (sStack_40 < 0x100) * (char)uStack_130 - (0xff < sStack_40);
    in_stack_fffffffffffffe35 =
         (0 < sStack_3e) * (sStack_3e < 0x100) * (char)((ulong)uStack_130 >> 0x10) -
         (0xff < sStack_3e);
    in_stack_fffffffffffffe36 =
         (0 < sStack_3c) * (sStack_3c < 0x100) * (char)((ulong)uStack_130 >> 0x20) -
         (0xff < sStack_3c);
    in_stack_fffffffffffffe37 =
         (0 < sStack_3a) * (sStack_3a < 0x100) * (char)((ulong)uStack_130 >> 0x30) -
         (0xff < sStack_3a);
    local_58 = (short)local_148;
    sStack_56 = (short)((ulong)local_148 >> 0x10);
    sStack_54 = (short)((ulong)local_148 >> 0x20);
    sStack_52 = (short)((ulong)local_148 >> 0x30);
    sStack_50 = (short)in_stack_fffffffffffffec0;
    sStack_4e = (short)((ulong)in_stack_fffffffffffffec0 >> 0x10);
    sStack_4c = (short)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    sStack_4a = (short)((ulong)in_stack_fffffffffffffec0 >> 0x30);
    local_68 = (short)local_158;
    sStack_66 = (short)((ulong)local_158 >> 0x10);
    sStack_64 = (short)((ulong)local_158 >> 0x20);
    sStack_62 = (short)((ulong)local_158 >> 0x30);
    sStack_60 = (short)uStack_150;
    sStack_5e = (short)((ulong)uStack_150 >> 0x10);
    sStack_5c = (short)((ulong)uStack_150 >> 0x20);
    sStack_5a = (short)((ulong)uStack_150 >> 0x30);
    in_stack_fffffffffffffe18 =
         (0 < local_58) * (local_58 < 0x100) * (char)local_148 - (0xff < local_58);
    in_stack_fffffffffffffe19 =
         (0 < sStack_56) * (sStack_56 < 0x100) * (char)((ulong)local_148 >> 0x10) -
         (0xff < sStack_56);
    in_stack_fffffffffffffe1a =
         (0 < sStack_54) * (sStack_54 < 0x100) * (char)((ulong)local_148 >> 0x20) -
         (0xff < sStack_54);
    in_stack_fffffffffffffe1b =
         (0 < sStack_52) * (sStack_52 < 0x100) * (char)((ulong)local_148 >> 0x30) -
         (0xff < sStack_52);
    in_stack_fffffffffffffe1c =
         (0 < sStack_50) * (sStack_50 < 0x100) * (char)in_stack_fffffffffffffec0 -
         (0xff < sStack_50);
    in_stack_fffffffffffffe1d =
         (0 < sStack_4e) * (sStack_4e < 0x100) * (char)((ulong)in_stack_fffffffffffffec0 >> 0x10) -
         (0xff < sStack_4e);
    in_stack_fffffffffffffe1e =
         (0 < sStack_4c) * (sStack_4c < 0x100) * (char)((ulong)in_stack_fffffffffffffec0 >> 0x20) -
         (0xff < sStack_4c);
    in_stack_fffffffffffffe1f =
         (0 < sStack_4a) * (sStack_4a < 0x100) * (char)((ulong)in_stack_fffffffffffffec0 >> 0x30) -
         (0xff < sStack_4a);
    in_stack_fffffffffffffe20 =
         (0 < local_68) * (local_68 < 0x100) * (char)local_158 - (0xff < local_68);
    in_stack_fffffffffffffe21 =
         (0 < sStack_66) * (sStack_66 < 0x100) * (char)((ulong)local_158 >> 0x10) -
         (0xff < sStack_66);
    in_stack_fffffffffffffe22 =
         (0 < sStack_64) * (sStack_64 < 0x100) * (char)((ulong)local_158 >> 0x20) -
         (0xff < sStack_64);
    in_stack_fffffffffffffe23 =
         (0 < sStack_62) * (sStack_62 < 0x100) * (char)((ulong)local_158 >> 0x30) -
         (0xff < sStack_62);
    in_stack_fffffffffffffe24 =
         (0 < sStack_60) * (sStack_60 < 0x100) * (char)uStack_150 - (0xff < sStack_60);
    in_stack_fffffffffffffe25 =
         (0 < sStack_5e) * (sStack_5e < 0x100) * (char)((ulong)uStack_150 >> 0x10) -
         (0xff < sStack_5e);
    in_stack_fffffffffffffe26 =
         (0 < sStack_5c) * (sStack_5c < 0x100) * (char)((ulong)uStack_150 >> 0x20) -
         (0xff < sStack_5c);
    in_stack_fffffffffffffe27 =
         (0 < sStack_5a) * (sStack_5a < 0x100) * (char)((ulong)uStack_150 >> 0x30) -
         (0xff < sStack_5a);
    local_78 = (short)local_168;
    sStack_76 = (short)((ulong)local_168 >> 0x10);
    sStack_74 = (short)((ulong)local_168 >> 0x20);
    sStack_72 = (short)((ulong)local_168 >> 0x30);
    sStack_70 = (short)uStack_160;
    sStack_6e = (short)((ulong)uStack_160 >> 0x10);
    sStack_6c = (short)((ulong)uStack_160 >> 0x20);
    sStack_6a = (short)((ulong)uStack_160 >> 0x30);
    local_88 = (short)local_178;
    sStack_86 = (short)((ulong)local_178 >> 0x10);
    sStack_84 = (short)((ulong)local_178 >> 0x20);
    sStack_82 = (short)((ulong)local_178 >> 0x30);
    sStack_80 = (short)uStack_170;
    sStack_7e = (short)((ulong)uStack_170 >> 0x10);
    sStack_7c = (short)((ulong)uStack_170 >> 0x20);
    sStack_7a = (short)((ulong)uStack_170 >> 0x30);
    in_stack_fffffffffffffe08 =
         (0 < local_78) * (local_78 < 0x100) * (char)local_168 - (0xff < local_78);
    in_stack_fffffffffffffe09 =
         (0 < sStack_76) * (sStack_76 < 0x100) * (char)((ulong)local_168 >> 0x10) -
         (0xff < sStack_76);
    in_stack_fffffffffffffe0a =
         (0 < sStack_74) * (sStack_74 < 0x100) * (char)((ulong)local_168 >> 0x20) -
         (0xff < sStack_74);
    in_stack_fffffffffffffe0b =
         (0 < sStack_72) * (sStack_72 < 0x100) * (char)((ulong)local_168 >> 0x30) -
         (0xff < sStack_72);
    in_stack_fffffffffffffe0c =
         (0 < sStack_70) * (sStack_70 < 0x100) * (char)uStack_160 - (0xff < sStack_70);
    in_stack_fffffffffffffe0d =
         (0 < sStack_6e) * (sStack_6e < 0x100) * (char)((ulong)uStack_160 >> 0x10) -
         (0xff < sStack_6e);
    in_stack_fffffffffffffe0e =
         (0 < sStack_6c) * (sStack_6c < 0x100) * (char)((ulong)uStack_160 >> 0x20) -
         (0xff < sStack_6c);
    in_stack_fffffffffffffe0f =
         (0 < sStack_6a) * (sStack_6a < 0x100) * (char)((ulong)uStack_160 >> 0x30) -
         (0xff < sStack_6a);
    in_stack_fffffffffffffe10 =
         (0 < local_88) * (local_88 < 0x100) * (char)local_178 - (0xff < local_88);
    in_stack_fffffffffffffe11 =
         (0 < sStack_86) * (sStack_86 < 0x100) * (char)((ulong)local_178 >> 0x10) -
         (0xff < sStack_86);
    in_stack_fffffffffffffe12 =
         (0 < sStack_84) * (sStack_84 < 0x100) * (char)((ulong)local_178 >> 0x20) -
         (0xff < sStack_84);
    in_stack_fffffffffffffe13 =
         (0 < sStack_82) * (sStack_82 < 0x100) * (char)((ulong)local_178 >> 0x30) -
         (0xff < sStack_82);
    in_stack_fffffffffffffe14 =
         (0 < sStack_80) * (sStack_80 < 0x100) * (char)uStack_170 - (0xff < sStack_80);
    in_stack_fffffffffffffe15 =
         (0 < sStack_7e) * (sStack_7e < 0x100) * (char)((ulong)uStack_170 >> 0x10) -
         (0xff < sStack_7e);
    in_stack_fffffffffffffe16 =
         (0 < sStack_7c) * (sStack_7c < 0x100) * (char)((ulong)uStack_170 >> 0x20) -
         (0xff < sStack_7c);
    in_stack_fffffffffffffe17 =
         (0 < sStack_7a) * (sStack_7a < 0x100) * (char)((ulong)uStack_170 >> 0x30) -
         (0xff < sStack_7a);
    local_98 = (short)local_188;
    sStack_96 = (short)((ulong)local_188 >> 0x10);
    sStack_94 = (short)((ulong)local_188 >> 0x20);
    sStack_92 = (short)((ulong)local_188 >> 0x30);
    sStack_90 = (short)uStack_180;
    sStack_8e = (short)((ulong)uStack_180 >> 0x10);
    sStack_8c = (short)((ulong)uStack_180 >> 0x20);
    sStack_8a = (short)((ulong)uStack_180 >> 0x30);
    local_b8 = (short)local_1a8;
    sStack_b6 = (short)((ulong)local_1a8 >> 0x10);
    sStack_b4 = (short)((ulong)local_1a8 >> 0x20);
    sStack_b2 = (short)((ulong)local_1a8 >> 0x30);
    sStack_b0 = (short)uStack_1a0;
    sStack_ae = (short)((ulong)uStack_1a0 >> 0x10);
    sStack_ac = (short)((ulong)uStack_1a0 >> 0x20);
    sStack_aa = (short)((ulong)uStack_1a0 >> 0x30);
    local_c8 = (short)local_1b8;
    sStack_c6 = (short)((ulong)local_1b8 >> 0x10);
    sStack_c4 = (short)((ulong)local_1b8 >> 0x20);
    sStack_c2 = (short)((ulong)local_1b8 >> 0x30);
    sStack_c0 = (short)uStack_1b0;
    sStack_be = (short)((ulong)uStack_1b0 >> 0x10);
    sStack_bc = (short)((ulong)uStack_1b0 >> 0x20);
    sStack_ba = (short)((ulong)uStack_1b0 >> 0x30);
    in_stack_fffffffffffffdd8 = local_e8;
    PlanarTo24b_SSE2((__m128i *)
                     CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) *
                              (char)((ulong)uStack_180 >> 0x30) - (0xff < sStack_8a),
                              CONCAT16((0 < sStack_8c) * (sStack_8c < 0x100) *
                                       (char)((ulong)uStack_180 >> 0x20) - (0xff < sStack_8c),
                                       CONCAT15((0 < sStack_8e) * (sStack_8e < 0x100) *
                                                (char)((ulong)uStack_180 >> 0x10) -
                                                (0xff < sStack_8e),
                                                CONCAT14((0 < sStack_90) * (sStack_90 < 0x100) *
                                                         (char)uStack_180 - (0xff < sStack_90),
                                                         CONCAT13((0 < sStack_92) *
                                                                  (sStack_92 < 0x100) *
                                                                  (char)((ulong)local_188 >> 0x30) -
                                                                  (0xff < sStack_92),
                                                                  CONCAT12((0 < sStack_94) *
                                                                           (sStack_94 < 0x100) *
                                                                           (char)((ulong)local_188
                                                                                 >> 0x20) -
                                                                           (0xff < sStack_94),
                                                                           CONCAT11((0 < sStack_96)
                                                                                    * (sStack_96 <
                                                                                      0x100) *
                                                                                    (char)((ulong)
                                                  local_188 >> 0x10) - (0xff < sStack_96),
                                                  (0 < local_98) * (local_98 < 0x100) *
                                                  (char)local_188 - (0xff < local_98)))))))),
                     (__m128i *)
                     CONCAT17((0 < sStack_ba) * (sStack_ba < 0x100) *
                              (char)((ulong)uStack_1b0 >> 0x30) - (0xff < sStack_ba),
                              CONCAT16((0 < sStack_bc) * (sStack_bc < 0x100) *
                                       (char)((ulong)uStack_1b0 >> 0x20) - (0xff < sStack_bc),
                                       CONCAT15((0 < sStack_be) * (sStack_be < 0x100) *
                                                (char)((ulong)uStack_1b0 >> 0x10) -
                                                (0xff < sStack_be),
                                                CONCAT14((0 < sStack_c0) * (sStack_c0 < 0x100) *
                                                         (char)uStack_1b0 - (0xff < sStack_c0),
                                                         CONCAT13((0 < sStack_c2) *
                                                                  (sStack_c2 < 0x100) *
                                                                  (char)((ulong)local_1b8 >> 0x30) -
                                                                  (0xff < sStack_c2),
                                                                  CONCAT12((0 < sStack_c4) *
                                                                           (sStack_c4 < 0x100) *
                                                                           (char)((ulong)local_1b8
                                                                                 >> 0x20) -
                                                                           (0xff < sStack_c4),
                                                                           CONCAT11((0 < sStack_c6)
                                                                                    * (sStack_c6 <
                                                                                      0x100) *
                                                                                    (char)((ulong)
                                                  local_1b8 >> 0x10) - (0xff < sStack_c6),
                                                  (0 < local_c8) * (local_c8 < 0x100) *
                                                  (char)local_1b8 - (0xff < local_c8)))))))),
                     (__m128i *)
                     CONCAT17((0 < sStack_aa) * (sStack_aa < 0x100) *
                              (char)((ulong)uStack_1a0 >> 0x30) - (0xff < sStack_aa),
                              CONCAT16((0 < sStack_ac) * (sStack_ac < 0x100) *
                                       (char)((ulong)uStack_1a0 >> 0x20) - (0xff < sStack_ac),
                                       CONCAT15((0 < sStack_ae) * (sStack_ae < 0x100) *
                                                (char)((ulong)uStack_1a0 >> 0x10) -
                                                (0xff < sStack_ae),
                                                CONCAT14((0 < sStack_b0) * (sStack_b0 < 0x100) *
                                                         (char)uStack_1a0 - (0xff < sStack_b0),
                                                         CONCAT13((0 < sStack_b2) *
                                                                  (sStack_b2 < 0x100) *
                                                                  (char)((ulong)local_1a8 >> 0x30) -
                                                                  (0xff < sStack_b2),
                                                                  CONCAT12((0 < sStack_b4) *
                                                                           (sStack_b4 < 0x100) *
                                                                           (char)((ulong)local_1a8
                                                                                 >> 0x20) -
                                                                           (0xff < sStack_b4),
                                                                           CONCAT11((0 < sStack_b6)
                                                                                    * (sStack_b6 <
                                                                                      0x100) *
                                                                                    (char)((ulong)
                                                  local_1a8 >> 0x10) - (0xff < sStack_b6),
                                                  (0 < local_b8) * (local_b8 < 0x100) *
                                                  (char)local_1a8 - (0xff < local_b8)))))))),
                     (__m128i *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     local_e8,(__m128i *)0x14dda2,in_stack_fffffffffffffec0);
    local_e8 = local_e8 + 6;
  }
  for (; local_f0 < in_R8D; local_f0 = local_f0 + 1) {
    VP8YuvToRgb(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,
                (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(uint8_t *)0x14de4c);
  }
  return;
}

Assistant:

static void YuvToRgbRow_SSE2(const uint8_t* WEBP_RESTRICT y,
                             const uint8_t* WEBP_RESTRICT u,
                             const uint8_t* WEBP_RESTRICT v,
                             uint8_t* WEBP_RESTRICT dst, int len) {
  int n;
  for (n = 0; n + 32 <= len; n += 32, dst += 32 * 3) {
    __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
    __m128i rgb0, rgb1, rgb2, rgb3, rgb4, rgb5;

    YUV420ToRGB_SSE2(y +  0, u +  0, v +  0, &R0, &G0, &B0);
    YUV420ToRGB_SSE2(y +  8, u +  4, v +  4, &R1, &G1, &B1);
    YUV420ToRGB_SSE2(y + 16, u +  8, v +  8, &R2, &G2, &B2);
    YUV420ToRGB_SSE2(y + 24, u + 12, v + 12, &R3, &G3, &B3);

    // Cast to 8b and store as RRRRGGGGBBBB.
    rgb0 = _mm_packus_epi16(R0, R1);
    rgb1 = _mm_packus_epi16(R2, R3);
    rgb2 = _mm_packus_epi16(G0, G1);
    rgb3 = _mm_packus_epi16(G2, G3);
    rgb4 = _mm_packus_epi16(B0, B1);
    rgb5 = _mm_packus_epi16(B2, B3);

    // Pack as RGBRGBRGBRGB.
    PlanarTo24b_SSE2(&rgb0, &rgb1, &rgb2, &rgb3, &rgb4, &rgb5, dst);

    y += 32;
    u += 16;
    v += 16;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToRgb(y[0], u[0], v[0], dst);
    dst += 3;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}